

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void convert_all_containers(roaring_bitmap_t *r,uint8_t dst_type)

{
  char in_SIL;
  int *in_RDI;
  run_container_t *dst_container_3;
  bitset_container_t *dst_container_2;
  array_container_t *dst_container_1;
  array_container_t *dst_container;
  int32_t i;
  int in_stack_ffffffffffffffcc;
  array_container_t *in_stack_ffffffffffffffd0;
  bitset_container_t *in_stack_ffffffffffffffd8;
  array_container_t *in_stack_ffffffffffffffe0;
  array_container_t *in_stack_ffffffffffffffe8;
  int local_10;
  
  for (local_10 = 0; local_10 < *in_RDI; local_10 = local_10 + 1) {
    if (*(char *)(*(long *)(in_RDI + 6) + (long)local_10) == '\x01') {
      in_stack_ffffffffffffffe8 =
           array_container_from_bitset((bitset_container_t *)in_stack_ffffffffffffffd0);
      bitset_container_free((bitset_container_t *)0x103803);
      *(array_container_t **)(*(long *)(in_RDI + 2) + (long)local_10 * 8) =
           in_stack_ffffffffffffffe8;
      *(undefined1 *)(*(long *)(in_RDI + 6) + (long)local_10) = 2;
    }
    else if (*(char *)(*(long *)(in_RDI + 6) + (long)local_10) == '\x03') {
      in_stack_ffffffffffffffe0 =
           array_container_from_run((run_container_t *)in_stack_ffffffffffffffe0);
      run_container_free((run_container_t *)0x103878);
      *(array_container_t **)(*(long *)(in_RDI + 2) + (long)local_10 * 8) =
           in_stack_ffffffffffffffe0;
      *(undefined1 *)(*(long *)(in_RDI + 6) + (long)local_10) = 2;
    }
    _assert_true((unsigned_long)in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,
                 (char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    if (in_SIL == '\x01') {
      in_stack_ffffffffffffffd8 = bitset_container_from_array(in_stack_ffffffffffffffd0);
      array_container_free((array_container_t *)0x103918);
      *(bitset_container_t **)(*(long *)(in_RDI + 2) + (long)local_10 * 8) =
           in_stack_ffffffffffffffd8;
      *(undefined1 *)(*(long *)(in_RDI + 6) + (long)local_10) = 1;
    }
    else if (in_SIL == '\x03') {
      in_stack_ffffffffffffffd0 =
           (array_container_t *)run_container_from_array(in_stack_ffffffffffffffe8);
      array_container_free((array_container_t *)0x103980);
      *(array_container_t **)(*(long *)(in_RDI + 2) + (long)local_10 * 8) =
           in_stack_ffffffffffffffd0;
      *(undefined1 *)(*(long *)(in_RDI + 6) + (long)local_10) = 3;
    }
    _assert_true((unsigned_long)in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,
                 (char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  return;
}

Assistant:

void convert_all_containers(roaring_bitmap_t *r, uint8_t dst_type) {
    for (int32_t i = 0; i < r->high_low_container.size; i++) {
        // first step: convert src_type to ARRAY
        if (r->high_low_container.typecodes[i] == BITSET_CONTAINER_TYPE) {
            array_container_t *dst_container = array_container_from_bitset(
                CAST_bitset(r->high_low_container.containers[i]));
            bitset_container_free(
                CAST_bitset(r->high_low_container.containers[i]));
            r->high_low_container.containers[i] = dst_container;
            r->high_low_container.typecodes[i] = ARRAY_CONTAINER_TYPE;
        } else if (r->high_low_container.typecodes[i] == RUN_CONTAINER_TYPE) {
            array_container_t *dst_container = array_container_from_run(
                CAST_run(r->high_low_container.containers[i]));
            run_container_free(CAST_run(r->high_low_container.containers[i]));
            r->high_low_container.containers[i] = dst_container;
            r->high_low_container.typecodes[i] = ARRAY_CONTAINER_TYPE;
        }
        assert_true(r->high_low_container.typecodes[i] == ARRAY_CONTAINER_TYPE);

        // second step: convert ARRAY to dst_type
        if (dst_type == BITSET_CONTAINER_TYPE) {
            bitset_container_t *dst_container = bitset_container_from_array(
                CAST_array(r->high_low_container.containers[i]));
            array_container_free(
                CAST_array(r->high_low_container.containers[i]));
            r->high_low_container.containers[i] = dst_container;
            r->high_low_container.typecodes[i] = BITSET_CONTAINER_TYPE;
        } else if (dst_type == RUN_CONTAINER_TYPE) {
            run_container_t *dst_container = run_container_from_array(
                CAST_array(r->high_low_container.containers[i]));
            array_container_free(
                CAST_array(r->high_low_container.containers[i]));
            r->high_low_container.containers[i] = dst_container;
            r->high_low_container.typecodes[i] = RUN_CONTAINER_TYPE;
        }
        assert_true(r->high_low_container.typecodes[i] == dst_type);
    }
}